

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

tensor * di(tensor *a,double q)

{
  Div *this;
  tensor *ptVar1;
  initializer_list<tensor_*> __l;
  allocator_type local_39;
  double local_38;
  tensor *local_30;
  _Vector_base<tensor_*,_std::allocator<tensor_*>_> local_28;
  
  local_38 = q;
  this = (Div *)operator_new(0x48);
  (this->super_node)._vptr_node = (_func_int **)0x0;
  (this->super_node).ret = (tensor *)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)&(this->super_node).isbuild = 0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node::node_cnt = node::node_cnt + 1;
  (this->super_node)._vptr_node = (_func_int **)&PTR_forward_00109ab0;
  __l._M_len = 1;
  __l._M_array = &local_30;
  local_30 = a;
  std::vector<tensor_*,_std::allocator<tensor_*>_>::vector
            ((vector<tensor_*,_std::allocator<tensor_*>_> *)&local_28,__l,&local_39);
  ptVar1 = Div::forward(this,(vector<tensor_*,_std::allocator<tensor_*>_> *)&local_28,local_38);
  std::_Vector_base<tensor_*,_std::allocator<tensor_*>_>::~_Vector_base(&local_28);
  return ptVar1;
}

Assistant:

tensor* di(tensor *a, double q){
    node *op = new Div();
    return op->forward({a},q);
}